

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CNumExp *expression)

{
  CExpressionWrapper *this_00;
  CConstExpression *this_01;
  CNumExp *expression_local;
  CBuildVisitor *this_local;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CNumExp\n");
  this_00 = (CExpressionWrapper *)operator_new(0x10);
  this_01 = (CConstExpression *)operator_new(0x10);
  IRT::CConstExpression::CConstExpression(this_01,expression->number);
  IRT::CExpressionWrapper::CExpressionWrapper(this_00,(CExpression *)this_01);
  updateSubtreeWrapper(this,(ISubtreeWrapper *)this_00);
  std::__cxx11::string::operator=((string *)&this->currentObjectClassName,"");
  return;
}

Assistant:

void CBuildVisitor::Visit( CNumExp &expression ) {
    std::cout << "IRT builder: CNumExp\n";
    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            new IRT::CConstExpression( expression.number )
    ));

    currentObjectClassName = "";
}